

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_u3d.c
# Opt level: O0

HPDF_Dict_conflict HPDF_3DView_New(HPDF_MMgr mmgr,HPDF_Xref xref,HPDF_U3D u3d,char *name)

{
  HPDF_STATUS HVar1;
  HPDF_String p_Var2;
  HPDF_Dict_conflict view;
  HPDF_STATUS ret;
  char *name_local;
  HPDF_U3D u3d_local;
  HPDF_Xref xref_local;
  HPDF_MMgr mmgr_local;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    mmgr_local = (HPDF_MMgr)HPDF_Dict_New(mmgr);
    if ((HPDF_Dict)mmgr_local == (HPDF_Dict)0x0) {
      mmgr_local = (HPDF_MMgr)0x0;
    }
    else {
      HVar1 = HPDF_Xref_Add(xref,mmgr_local);
      if (HVar1 == 0) {
        HVar1 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"TYPE","3DView");
        if (HVar1 == 0) {
          p_Var2 = HPDF_String_New(mmgr,name,(HPDF_Encoder_conflict)0x0);
          HVar1 = HPDF_Dict_Add((HPDF_Dict)mmgr_local,"XN",p_Var2);
          if (HVar1 == 0) {
            p_Var2 = HPDF_String_New(mmgr,name,(HPDF_Encoder_conflict)0x0);
            HVar1 = HPDF_Dict_Add((HPDF_Dict)mmgr_local,"IN",p_Var2);
            if (HVar1 == 0) {
              HVar1 = HPDF_U3D_Add3DView(u3d,(HPDF_Dict_conflict)mmgr_local);
              if (HVar1 != 0) {
                HPDF_Dict_Free((HPDF_Dict)mmgr_local);
                mmgr_local = (HPDF_MMgr)0x0;
              }
            }
            else {
              HPDF_Dict_Free((HPDF_Dict)mmgr_local);
              mmgr_local = (HPDF_MMgr)0x0;
            }
          }
          else {
            HPDF_Dict_Free((HPDF_Dict)mmgr_local);
            mmgr_local = (HPDF_MMgr)0x0;
          }
        }
        else {
          HPDF_Dict_Free((HPDF_Dict)mmgr_local);
          mmgr_local = (HPDF_MMgr)0x0;
        }
      }
      else {
        mmgr_local = (HPDF_MMgr)0x0;
      }
    }
  }
  return (HPDF_Dict_conflict)mmgr_local;
}

Assistant:

HPDF_Dict HPDF_3DView_New( HPDF_MMgr  mmgr, HPDF_Xref  xref, HPDF_U3D u3d, const char *name)
{
	HPDF_STATUS ret = HPDF_OK;
	HPDF_Dict view;

	HPDF_PTRACE ((" HPDF_3DView_New\n"));

	if (name == NULL || name[0] == '\0') {
		return NULL;
	}

	view = HPDF_Dict_New (mmgr);
	if (!view) {
		return NULL;
	}

	if (HPDF_Xref_Add (xref, view) != HPDF_OK)
        return NULL;

	ret = HPDF_Dict_AddName (view, "TYPE", "3DView");
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_Dict_Add (view, "XN", HPDF_String_New (mmgr, name, NULL));
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_Dict_Add (view, "IN", HPDF_String_New (mmgr, name, NULL));
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	ret = HPDF_U3D_Add3DView( u3d, view);
	if (ret != HPDF_OK) {
		HPDF_Dict_Free (view);
		return NULL;
	}

	return view;
}